

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedBlending.cpp
# Opt level: O3

bool __thiscall
glcts::DrawBuffersIndexedBlending::VerifyImg
          (DrawBuffersIndexedBlending *this,TextureLevel *textureLevel,RGBA expectedColor,
          RGBA epsilon)

{
  ostringstream *this_00;
  ChannelOrder CVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ChannelOrder CVar8;
  int z;
  int iVar9;
  int iVar10;
  int iVar11;
  RGBA pixel;
  RGBA local_1cc;
  DrawBuffersIndexedBlending *local_1c8;
  undefined1 local_1c0 [16];
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  iVar11 = (textureLevel->m_size).m_data[1];
  if (0 < iVar11) {
    uVar5 = expectedColor.m_value >> 8 & 0xff;
    uVar6 = expectedColor.m_value >> 0x10 & 0xff;
    iVar7 = (textureLevel->m_size).m_data[0];
    z = 0;
    local_1c8 = this;
    do {
      if (0 < iVar7) {
        iVar11 = 0;
        do {
          tcu::TextureLevel::getAccess((ConstPixelBufferAccess *)local_1b0,textureLevel);
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_1c0,(int)(ConstPixelBufferAccess *)local_1b0,
                     iVar11,z);
          tcu::RGBA::RGBA(&local_1cc,(Vec4 *)local_1c0);
          if (local_1cc.m_value != expectedColor.m_value) {
            CVar8 = (local_1cc.m_value & 0xff) - (expectedColor.m_value & 0xff);
            CVar1 = -CVar8;
            if (0 < (int)CVar8) {
              CVar1 = CVar8;
            }
            iVar9 = (local_1cc.m_value >> 8 & 0xff) - uVar5;
            iVar7 = -iVar9;
            if (0 < iVar9) {
              iVar7 = iVar9;
            }
            iVar10 = (local_1cc.m_value >> 0x10 & 0xff) - uVar6;
            iVar9 = -iVar10;
            if (0 < iVar10) {
              iVar9 = iVar10;
            }
            iVar3 = (local_1cc.m_value >> 0x18) - (expectedColor.m_value >> 0x18);
            iVar10 = -iVar3;
            if (0 < iVar3) {
              iVar10 = iVar3;
            }
            local_1b0._0_4_ = iVar9 << 0x10 | iVar7 << 8 | iVar10 << 0x18 | CVar1;
            bVar2 = tcu::RGBA::isBelowThreshold((RGBA *)local_1b0,epsilon);
            if (!bVar2) {
              local_1b0._0_8_ =
                   ((local_1c8->super_DrawBuffersIndexedBase).super_TestCaseBase.super_TestCase.
                    super_TestNode.m_testCtx)->m_log;
              this_00 = (ostringstream *)(local_1b0 + 8);
              std::__cxx11::ostringstream::ostringstream(this_00);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this_00,"Expected value: ",0x10);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"RGBA(",5);
              poVar4 = (ostream *)std::ostream::operator<<(this_00,expectedColor.m_value & 0xff);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar5);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar6);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,expectedColor.m_value >> 0x18);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this_00,"Read value:     ",0x10);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"RGBA(",5);
              poVar4 = (ostream *)std::ostream::operator<<(this_00,local_1cc.m_value & 0xff);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_1cc.m_value >> 8 & 0xff);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_1cc.m_value >> 0x10 & 0xff);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_1cc.m_value >> 0x18);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)this_00,"Epsilon:        ",0x10);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"RGBA(",5);
              poVar4 = (ostream *)std::ostream::operator<<(this_00,epsilon.m_value & 0xff);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,epsilon.m_value >> 8 & 0xff);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,epsilon.m_value >> 0x10 & 0xff);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
              poVar4 = (ostream *)std::ostream::operator<<(poVar4,epsilon.m_value >> 0x18);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream(this_00);
              std::ios_base::~ios_base(local_138);
              return false;
            }
          }
          iVar11 = iVar11 + 1;
          iVar7 = (textureLevel->m_size).m_data[0];
        } while (iVar11 < iVar7);
        iVar11 = (textureLevel->m_size).m_data[1];
      }
      z = z + 1;
    } while (z < iVar11);
  }
  return true;
}

Assistant:

bool DrawBuffersIndexedBlending::VerifyImg(const tcu::TextureLevel& textureLevel, tcu::RGBA expectedColor,
										   tcu::RGBA epsilon)
{
	for (int y = 0; y < textureLevel.getHeight(); ++y)
	{
		for (int x = 0; x < textureLevel.getWidth(); ++x)
		{
			tcu::RGBA pixel(textureLevel.getAccess().getPixel(x, y));
			if (!tcu::compareThreshold(pixel, expectedColor, epsilon))
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Expected value: " << expectedColor << "\n"
								   << "Read value:     " << pixel << "\n"
								   << "Epsilon:        " << epsilon << tcu::TestLog::EndMessage;
				return false;
			}
		}
	}
	return true;
}